

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

ssize_t __thiscall fmt::v5::file::read(file *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t __nbytes_00;
  ssize_t value;
  int *piVar1;
  char *s;
  type tVar2;
  undefined4 in_register_00000034;
  bool bVar3;
  system_error *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  RWResult result;
  undefined4 in_stack_ffffffffffffffa0;
  file *pfVar4;
  int iVar5;
  
  pfVar4 = this;
  do {
    iVar5 = this->fd_;
    __nbytes_00 = anon_unknown.dwarf_93a0d::convert_rwcount((size_t)__buf);
    value = ::read(iVar5,(void *)CONCAT44(in_register_00000034,__fd),__nbytes_00);
    bVar3 = false;
    if (value == -1) {
      piVar1 = __errno_location();
      bVar3 = *piVar1 == 4;
    }
    iVar5 = (int)((ulong)pfVar4 >> 0x20);
  } while (bVar3);
  if (value < 0) {
    s = (char *)__cxa_allocate_exception(0x18);
    piVar1 = __errno_location();
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)CONCAT44(*piVar1,in_stack_ffffffffffffffa0),s);
    system_error::system_error<>(unaff_retaddr,iVar5,(string_view)in_stack_00000008);
    __cxa_throw(s,&system_error::typeinfo,system_error::~system_error);
  }
  tVar2 = internal::to_unsigned<long>(value);
  return tVar2;
}

Assistant:

std::size_t file::read(void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(read(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(system_error(errno, "cannot read from file"));
  return internal::to_unsigned(result);
}